

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_filter_plain_scalar(Parser *this,substr s,size_t indentation)

{
  byte bVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_t num_characters;
  ro_substr chars;
  basic_substring<char> r;
  csubstr cVar9;
  size_t pos;
  char msg [42];
  size_t local_d0;
  size_t local_c8;
  undefined7 uStack_c0;
  undefined1 uStack_b9;
  undefined7 uStack_b8;
  undefined1 uStack_b1;
  undefined2 uStack_b0;
  undefined5 local_ae;
  undefined1 uStack_a9;
  undefined2 uStack_a8;
  char acStack_a6 [14];
  size_t local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<char> local_40;
  
  local_40.len = s.len;
  local_40.str = s.str;
  chars.len = 2;
  chars.str = " \t";
  local_98 = indentation;
  r = basic_substring<char>::triml(&local_40,chars);
  uVar8 = r.len;
  uVar7 = (this->m_filter_arena).len;
  if (uVar7 < uVar8) {
    uVar7 = uVar7 * 2;
    if (uVar7 <= uVar8) {
      uVar7 = uVar8;
    }
    num_characters = 0x80;
    if (0x80 < uVar7) {
      num_characters = uVar7;
    }
    _resize_filter_arena(this,num_characters);
  }
  else {
    local_d0 = 0;
    local_c8 = 0;
    if (uVar8 == 0) {
      bVar5 = false;
      goto LAB_00227da4;
    }
  }
  local_c8 = 0;
  local_d0 = 0;
  bVar5 = false;
  do {
    bVar1 = r.str[local_c8];
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
LAB_00227c96:
        _filter_ws<false>(this,r,&local_c8,&local_d0);
      }
      else if (bVar1 == 10) {
        bVar5 = _filter_nl<false,false>(this,r,&local_c8,&local_d0,local_98);
      }
      else {
LAB_00227cac:
        (this->m_filter_arena).str[local_d0] = bVar1;
        local_d0 = local_d0 + 1;
      }
    }
    else if (bVar1 != 0xd) {
      if (bVar1 != 0x20) goto LAB_00227cac;
      goto LAB_00227c96;
    }
    local_c8 = local_c8 + 1;
  } while (local_c8 < uVar8);
  if ((this->m_filter_arena).len < local_d0) {
    uStack_a8 = 0x6572;
    builtin_strncpy(acStack_a6,"na.len)",8);
    uStack_b8 = 0x6d203d3c20736f;
    uStack_b1 = 0x5f;
    uStack_b0 = 0x6966;
    local_ae = 0x5f7265746c;
    uStack_a9 = 0x61;
    local_c8._0_1_ = 'c';
    local_c8._1_1_ = 'h';
    local_c8._2_1_ = 'e';
    local_c8._3_1_ = 'c';
    local_c8._4_1_ = 'k';
    local_c8._5_1_ = ' ';
    local_c8._6_1_ = 'f';
    local_c8._7_1_ = 'a';
    uStack_c0 = 0x28203a64656c69;
    uStack_b9 = 0x70;
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        cVar9 = (csubstr)(*pcVar2)();
        return cVar9;
      }
    }
    local_68 = 0;
    uStack_60 = 0x7c36;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7c36) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7c36) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_c8,0x2a,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
LAB_00227da4:
  if ((local_d0 < uVar8) || (bVar5 != false)) {
    r = _finish_filter_arena(this,r,local_d0);
  }
  if (local_40.len < r.len) {
    uStack_b8 = 0x3d3e206e656c2e;
    uStack_b1 = 0x20;
    uStack_b0 = 0x2e72;
    local_ae = 0x296e656c;
    local_c8._0_1_ = 'c';
    local_c8._1_1_ = 'h';
    local_c8._2_1_ = 'e';
    local_c8._3_1_ = 'c';
    local_c8._4_1_ = 'k';
    local_c8._5_1_ = ' ';
    local_c8._6_1_ = 'f';
    local_c8._7_1_ = 'a';
    uStack_c0 = 0x28203a64656c69;
    uStack_b9 = 0x73;
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        cVar9 = (csubstr)(*pcVar2)();
        return cVar9;
      }
    }
    local_90 = 0;
    uStack_88 = 0x7c3c;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7c3c) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7c3c) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_c8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  cVar9.str = r.str;
  cVar9.len = r.len;
  return cVar9;
}

Assistant:

csubstr Parser::_filter_plain_scalar(substr s, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfps(...) _c4dbgpf("filt_plain_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfps(...)
    #endif

    _c4dbgfps("before=~~~{}~~~", s);

    substr r = s.triml(" \t");
    _grow_filter_arena(r.len);
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r.str[i];
        _c4dbgfps("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/false>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/false>(r, &i, &pos, indentation);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else
        {
            m_filter_arena.str[pos++] = r[i];
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgfps("#filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfps
    return r;
}